

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopBestLiteralCover
               (Kit_Sop_t *cResult,Kit_Sop_t *cSop,uint uCube,int nLits,Vec_Int_t *vMemory)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = Kit_SopBestLiteral(cSop,nLits,uCube);
  iVar1 = vMemory->nSize;
  vMemory->nSize = iVar1 + 1;
  piVar2 = vMemory->pArray;
  cResult->pCubes = (uint *)(piVar2 + iVar1);
  cResult->nCubes = 1;
  piVar2[iVar1] = 1 << ((byte)iVar3 & 0x1f);
  return;
}

Assistant:

void Kit_SopBestLiteralCover( Kit_Sop_t * cResult, Kit_Sop_t * cSop, unsigned uCube, int nLits, Vec_Int_t * vMemory )
{
    int iLitBest;
    // get the best literal
    iLitBest = Kit_SopBestLiteral( cSop, nLits, uCube );
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, 1 );
    // set the cube
    Kit_SopPushCube( cResult, Kit_CubeSetLit(0, iLitBest) );
}